

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Resume * __thiscall
wasm::Builder::makeResume
          (Builder *this,vector<wasm::Name,_std::allocator<wasm::Name>_> *handlerTags,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *handlerBlocks,
          vector<wasm::Type,_std::allocator<wasm::Type>_> *sentTypes,ExpressionList *operands,
          Expression *cont)

{
  Resume *this_00;
  
  this_00 = MixedArena::alloc<wasm::Resume>(&this->wasm->allocator);
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&this_00->handlerTags,
             handlerTags);
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&this_00->handlerBlocks,
             handlerBlocks);
  ArenaVectorBase<ArenaVector<wasm::Type>,wasm::Type>::
  set<std::vector<wasm::Type,std::allocator<wasm::Type>>>
            ((ArenaVectorBase<ArenaVector<wasm::Type>,wasm::Type> *)&this_00->sentTypes,sentTypes);
  ArenaVector<wasm::Expression_*>::operator=(&this_00->operands,operands);
  this_00->cont = cont;
  Resume::finalize(this_00);
  return this_00;
}

Assistant:

Resume* makeResume(const std::vector<Name>& handlerTags,
                     const std::vector<Name>& handlerBlocks,
                     const std::vector<Type>& sentTypes,
                     ExpressionList&& operands,
                     Expression* cont) {
    auto* ret = wasm.allocator.alloc<Resume>();
    ret->handlerTags.set(handlerTags);
    ret->handlerBlocks.set(handlerBlocks);
    ret->sentTypes.set(sentTypes);
    ret->operands = std::move(operands);
    ret->cont = cont;
    ret->finalize();
    return ret;
  }